

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  double dVar5;
  
  uVar3 = (uint)pMem->flags;
  if ((pMem->flags & 0xd) == 0) {
    iVar2 = sqlite3Atoi64(pMem->z,&(pMem->u).i,pMem->n,pMem->enc);
    if (iVar2 == 0) {
      uVar3._0_2_ = pMem->flags;
      uVar3._2_1_ = pMem->type;
      uVar3._3_1_ = pMem->enc;
      uVar3 = uVar3 & 0xffffbe00 | 4;
    }
    else {
      dVar5 = sqlite3VdbeRealValue(pMem);
      pMem->r = dVar5;
      uVar1._0_2_ = pMem->flags;
      uVar1._2_1_ = pMem->type;
      uVar1._3_1_ = pMem->enc;
      lVar4 = (long)dVar5;
      if (9.223372036854776e+18 < ABS(dVar5)) {
        lVar4 = -0x8000000000000000;
      }
      (pMem->u).i = lVar4;
      uVar3 = (uVar1 & 0xffffbe00) +
              (uint)(1 < lVar4 + 0x8000000000000001U && dVar5 == (double)lVar4) * 4 + 8;
    }
  }
  pMem->flags = (u16)(uVar3 & 0xffed);
  return uVar3 & 0xffed;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))==0 ){
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    if( 0==sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc) ){
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      pMem->r = sqlite3VdbeRealValue(pMem);
      MemSetTypeFlag(pMem, MEM_Real);
      sqlite3VdbeIntegerAffinity(pMem);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob);
  return SQLITE_OK;
}